

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint in_EAX;
  int iVar1;
  int num;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  while( true ) {
    while( true ) {
      printf("Please enter a non-zero number from 5 to 15 or 20: ");
      iVar1 = __isoc99_scanf("%d",(long)&uStack_38 + 4);
      if (iVar1 == 1) break;
      if (iVar1 == -1) {
        putchar(10);
        return 0;
      }
      puts("The number you entered is not valid!");
      if (iVar1 == 0) {
        __isoc99_scanf("%*[^\n]");
      }
    }
    if ((uStack_38._4_4_ == 0x14) || (uStack_38._4_4_ - 5U < 0xb)) break;
    puts("The number you entered is not valid!");
  }
  puts("Good human!");
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  int num = 0;

  while (true) {
    printf("Please enter a non-zero number from 5 to 15 or 20: ");

    const int res = scanf("%d", &num);
    if (res == 1 && (num == 20 || (num >= 5 && num <= 15))) break;
    else if (res == EOF) {
      printf("\n");
      return 0;
    } else {
      printf("The number you entered is not valid!\n");
      if (res == 0) scanf("%*[^\n]");
    }
  }

  printf("Good human!\n");

  return 0;
}